

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::extractLaneSI16x8(Literal *__return_storage_ptr__,Literal *this,uint8_t index)

{
  reference other;
  undefined3 in_register_00000011;
  undefined4 in_register_00000014;
  LaneArray<8> local_e0;
  
  getLanes<short,8>(&local_e0,(wasm *)this,
                    (Literal *)CONCAT44(in_register_00000014,CONCAT31(in_register_00000011,index)));
  other = std::array<wasm::Literal,_8UL>::at(&local_e0,(ulong)CONCAT31(in_register_00000011,index));
  Literal(__return_storage_ptr__,other);
  std::array<wasm::Literal,_8UL>::~array(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::extractLaneSI16x8(uint8_t index) const {
  return getLanesSI16x8().at(index);
}